

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O2

Variant * __thiscall
Jinx::Impl::Script::CallFunction(Variant *__return_storage_ptr__,Script *this,RuntimeID id)

{
  bool bVar1;
  bool bVar2;
  FunctionDefinitionPtr functionDef;
  function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
  local_40;
  
  Runtime::FindFunction
            ((Runtime *)&functionDef,
             (RuntimeID)
             (this->m_runtime).super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  if (functionDef.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    Error(this,"Could not find function definition");
    Jinx::Variant::Variant(__return_storage_ptr__,false);
  }
  else if (((functionDef.
             super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
           (element_type *)0x0) {
    std::
    function<Jinx::Variant_(std::shared_ptr<Jinx::IScript>,_const_std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>_&)>
    ::function(&local_40,
               &(functionDef.
                 super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_callback);
    Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_40);
    if (local_40.super__Function_base._M_manager == (_Manager_type)0x0) {
      Error(this,"Error in function definition");
      __return_storage_ptr__->m_type = Null;
      Jinx::Variant::SetNull(__return_storage_ptr__);
    }
    else {
      CallNativeFunction(__return_storage_ptr__,this,&functionDef);
    }
  }
  else {
    CallBytecodeFunction(this,&functionDef,Wait);
    bVar1 = this->m_finished;
    this->m_finished = false;
    bVar2 = Execute(this);
    if (bVar2) {
      this->m_finished = bVar1;
      Pop(__return_storage_ptr__,this);
    }
    else {
      __return_storage_ptr__->m_type = Null;
      Jinx::Variant::SetNull(__return_storage_ptr__);
    }
  }
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &functionDef.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant Script::CallFunction(RuntimeID id)
	{
		FunctionDefinitionPtr functionDef = m_runtime->FindFunction(id);
		if (!functionDef)
		{
			Error("Could not find function definition");
			return false;
		}
		// Check to see if this is a bytecode function
		if (functionDef->GetBytecode())
		{
			CallBytecodeFunction(functionDef, OnReturn::Wait);
			bool finished = m_finished;
			m_finished = false;
			if (!Execute())
				return nullptr;
			m_finished = finished;
			return Pop();
		}
		// Otherwise, call a native function callback
		else if (functionDef->GetCallback())
		{
			return CallNativeFunction(functionDef);
		}
		else
		{
			Error("Error in function definition");
		}
		return nullptr;
	}